

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rp.cpp
# Opt level: O3

uint64_t substitution_round<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
                   (hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *Q,
                   TP_t *TP,text_t *T)

{
  int *piVar1;
  itype iVar2;
  long lVar3;
  pointer ppVar4;
  bool bVar5;
  uint uVar6;
  cpair cVar7;
  cpair cVar8;
  ulong uVar9;
  ulong uVar10;
  itype iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  itype iVar15;
  cpair cVar16;
  cpair AB;
  cpair local_78;
  hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *local_70;
  TP_t *local_68;
  pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int> *local_60;
  ulong local_58;
  uint local_4c;
  text_t *local_48;
  ulong local_40;
  uint64_t local_38;
  
  local_70 = Q;
  local_68 = TP;
  local_78 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::max(Q);
  if (G.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      G.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
    ::_M_realloc_insert<std::pair<unsigned_int,unsigned_int>const&>
              ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)&G,(iterator)
                     G.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_78);
  }
  else {
    ppVar4 = G.
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar4->first = local_78.first;
    ppVar4->second = local_78.second;
    G.
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         G.
         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  lVar3 = *(long *)&(local_70->H).H.
                    super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(ulong)local_78 & 0xffffffff].
                    super__Vector_base<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data;
  uVar9 = *(ulong *)(lVar3 + ((ulong)local_78 >> 0x20) * 0xc);
  uVar14 = *(uint *)(lVar3 + 8 + ((ulong)local_78 >> 0x20) * 0xc);
  local_38 = (uint64_t)uVar14;
  uVar10 = uVar9 >> 0x20;
  n_distinct_freqs = n_distinct_freqs + (uVar14 != last_freq);
  uVar6 = (int)(uVar9 >> 0x20) + (uint)uVar9;
  last_freq = uVar14;
  if ((uint)uVar9 < uVar6) {
    uVar12 = uVar9 & 0xffffffff;
    local_60 = &local_70->H;
    local_58 = uVar10;
    local_4c = uVar6;
    local_40 = uVar9;
    do {
      uVar14 = (local_68->TP).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar12];
      cVar7 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at(T,uVar14);
      if ((local_78.first == cVar7.first) && (local_78.second == cVar7.second)) {
        cVar7 = skippable_text<unsigned_int,_unsigned_int>::pair_ending_at(T,uVar14);
        cVar8 = skippable_text<unsigned_int,_unsigned_int>::next_pair(T,uVar14);
        skippable_text<unsigned_int,_unsigned_int>::replace(T,uVar14,X);
        bVar5 = pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int>::count(local_60,cVar7);
        if (bVar5) {
          if ((local_78.first != cVar7.first) || (local_78.second != cVar7.second)) {
            piVar1 = (int *)(*(long *)&(local_70->H).H.
                                       super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [(ulong)cVar7 & 0xffffffff].
                                       super__Vector_base<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data + 8 +
                            ((ulong)cVar7 >> 0x20) * 0xc);
            *piVar1 = *piVar1 + -1;
          }
        }
        bVar5 = pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int>::count(local_60,cVar8);
        if (bVar5) {
          if ((local_78.first != cVar8.first) || (local_78.second != cVar8.second)) {
            piVar1 = (int *)(*(long *)&(local_70->H).H.
                                       super__Vector_base<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>,_std::allocator<std::vector<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [(ulong)cVar8 & 0xffffffff].
                                       super__Vector_base<triple<unsigned_int>,_std::allocator<triple<unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data + 8 +
                            ((ulong)cVar8 >> 0x20) * 0xc);
            *piVar1 = *piVar1 + -1;
          }
        }
      }
      uVar12 = uVar12 + 1;
      uVar14 = (int)uVar10 - 1;
      uVar10 = (ulong)uVar14;
    } while (uVar14 != 0);
    if ((uint)local_40 < local_4c) {
      uVar10 = local_40 & 0xffffffff;
      uVar9 = local_58;
      local_48 = T;
      do {
        uVar14 = (local_68->TP).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar10];
        uVar6 = skippable_text<unsigned_int,_unsigned_int>::at(T,uVar14);
        if (uVar6 == X) {
          local_58 = uVar9;
          cVar7 = skippable_text<unsigned_int,_unsigned_int>::pair_ending_at(T,uVar14);
          cVar8 = skippable_text<unsigned_int,_unsigned_int>::pair_starting_at(T,uVar14);
          uVar9 = (ulong)cVar8 >> 0x20;
          iVar15 = cVar7.first;
          iVar11 = iVar15;
          if (X == iVar15) {
            iVar11 = local_78.second;
          }
          uVar14 = cVar8.second;
          iVar2 = T->BLANK;
          if (X == uVar14) {
            uVar9 = (ulong)local_78 & 0xffffffff;
          }
          uVar12 = (ulong)local_78 & 0xffffffff;
          if (iVar2 == cVar7.second && iVar2 == iVar15) {
            iVar11 = iVar15;
            uVar12 = (ulong)cVar7 >> 0x20;
          }
          bVar5 = iVar2 == cVar8.first;
          if (iVar2 == uVar14 && bVar5) {
            uVar9 = (ulong)uVar14;
          }
          uVar13 = (ulong)local_78.second;
          if (iVar2 == uVar14 && bVar5) {
            uVar13 = (ulong)cVar8 & 0xffffffff;
          }
          cVar16 = (cpair)(uVar13 + (uVar9 << 0x20));
          bVar5 = pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int>::count
                            (local_60,cVar16);
          if ((bVar5) && (((uint)uVar13 != local_78.first || ((uint)uVar9 != local_78.second)))) {
            synchro_or_remove_pair<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
                      (local_70,local_68,local_48,cVar16);
          }
          cVar16 = (cpair)((ulong)iVar11 | uVar12 << 0x20);
          bVar5 = pair_hash<triple<unsigned_int>,_unsigned_int,_unsigned_int>::count
                            (local_60,cVar16);
          T = local_48;
          uVar9 = local_58;
          if ((bVar5) && ((iVar11 != local_78.first || ((uint)uVar12 != local_78.second)))) {
            synchro_or_remove_pair<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
                      (local_70,local_68,local_48,cVar16);
          }
        }
        uVar10 = uVar10 + 1;
        uVar14 = (int)uVar9 - 1;
        uVar9 = (ulong)uVar14;
      } while (uVar14 != 0);
    }
  }
  synchronize<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
            (local_70,local_68,T,local_78);
  X = X + 1;
  return local_38;
}

Assistant:

uint64_t substitution_round(queue_t & Q, TP_t & TP, text_t & T){

	using ctype = text_t::char_type;

	//compute max
	cpair AB = Q.max();

	G.push_back(AB);

	//cout << "MAX freq = " << Q[AB].F_ab << endl;

	assert(Q.contains(AB));
	assert(Q[AB].F_ab >= Q.minimum_frequency());

	//extract P_AB and L_AB
	auto q_el = Q[AB];
	itype F_AB = q_el.F_ab;
	itype P_AB = q_el.P_ab;
	itype L_AB = q_el.L_ab;

	uint64_t f_replaced = F_AB;

	n_distinct_freqs += (F_AB != last_freq);
	last_freq = F_AB;

	for(itype j = P_AB; j<P_AB+L_AB;++j){

		itype i = TP[j];

		if(T.pair_starting_at(i) == AB){

			ctype A = AB.first;
			ctype B = AB.second;

			//the context of AB is xABy. We now extract AB's context:
			cpair xA = T.pair_ending_at(i);
			cpair By = T.next_pair(i);

			assert(xA == T.blank_pair() or xA.second == A);
			assert(By == T.blank_pair() or By.first == B);

			//note: xA and By could be blank pairs if this AB was the first/last pair in the text

			//perform replacement
			T.replace(i,X);

			assert(By == T.blank_pair() || T.pair_starting_at(i) == cpair(X,By.second));

			if(Q.contains(xA) && xA != AB){

				Q.decrease(xA);

			}

			if(Q.contains(By) && By != AB){

				Q.decrease(By);

			}

		}

	}

	/*
	 * re-scan text positions associated to AB and synchronize if needed
	 */
	for(itype j = P_AB; j<P_AB+L_AB;++j){

		itype i = TP[j];

		assert(T.pair_starting_at(i) != AB); //we replaced all ABs ...

		if(T[i] == X){

			//the context of X is xXy. We now extract X's left (x) and right (y) contexts:
			cpair xX = T.pair_ending_at(i);
			cpair Xy = T.pair_starting_at(i);

			ctype A = AB.first;
			ctype B = AB.second;

			//careful: x and y could be = X. in this case, before the replacements this xX was equal to ABAB -> a BA disappeared
			ctype x = xX.first == X ? B : xX.first;
			ctype y = Xy.second == X ? A : Xy.second;

			//these are the pairs that disappeared
			cpair xA = xX == T.blank_pair() ? xX : cpair {x,A};
			cpair By = Xy == T.blank_pair() ? Xy : cpair {B,y};

			if(Q.contains(By) && By != AB){

				synchro_or_remove_pair<queue_t>(Q, TP, T, By);

			}

			if(Q.contains(xA) && xA != AB){

				synchro_or_remove_pair<queue_t>(Q, TP, T, xA);

			}

		}

	}

	assert(Q.contains(AB));
	synchronize<queue_t>(Q, TP, T, AB); //automatically removes AB since new AB's frequency is 0
	assert(not Q.contains(AB));

	//advance next free dictionary symbol
	X++;

	//cout << " current text size = " << T.number_of_non_blank_characters() << endl << endl;

	return f_replaced;

}